

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::GetBytesDefaultValueInternal_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  bool bVar1;
  char *in_RCX;
  AlphaNum *in_R8;
  string_view input;
  AlphaNum local_108;
  string_view local_d8;
  string local_c8;
  AlphaNum local_a8;
  AlphaNum local_78;
  allocator<char> local_31;
  string_view local_30;
  FieldDescriptor *local_20;
  FieldDescriptor *descriptor_local;
  FieldGeneratorBase *this_local;
  
  local_20 = descriptor;
  descriptor_local = (FieldDescriptor *)this;
  this_local = (FieldGeneratorBase *)__return_storage_ptr__;
  local_30 = FieldDescriptor::default_value_string(descriptor);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_30);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"pb::ByteString.Empty",&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  else {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_78,"pb::ByteString.FromBase64(\"");
    local_d8 = FieldDescriptor::default_value_string(local_20);
    input._M_str = in_RCX;
    input._M_len = (size_t)local_d8._M_str;
    StringToBase64_abi_cxx11_(&local_c8,(csharp *)local_d8._M_len,input);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_a8,&local_c8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_108,"\")");
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_78,&local_a8,&local_108,in_R8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::GetBytesDefaultValueInternal(const FieldDescriptor* descriptor) {
    if (descriptor->default_value_string().empty())
        return "pb::ByteString.Empty";
    return absl::StrCat("pb::ByteString.FromBase64(\"",
                        StringToBase64(descriptor->default_value_string()),
                        "\")");
}